

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O2

void Abc_FrameCopyLTLDataBase(Abc_Frame_t *pAbc,Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  char *__s;
  size_t sVar2;
  char *__dest;
  int i;
  
  pVVar1 = pAbc->vLTLProperties_global;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1->pArray);
    free(pVVar1);
  }
  pVVar1 = Vec_PtrAlloc(pNtk->vLtlProperties->nSize);
  pAbc->vLTLProperties_global = pVVar1;
  for (i = 0; i < pNtk->vLtlProperties->nSize; i = i + 1) {
    __s = (char *)Vec_PtrEntry(pNtk->vLtlProperties,i);
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
    Vec_PtrPush(pAbc->vLTLProperties_global,__dest);
  }
  return;
}

Assistant:

void Abc_FrameCopyLTLDataBase( Abc_Frame_t *pAbc, Abc_Ntk_t * pNtk )
{
    char *pLtlFormula, *tempFormula;
    int i;

    if( pAbc->vLTLProperties_global != NULL )
    {
//        printf("Deleting exisitng LTL database from the frame\n");
        Vec_PtrFree( pAbc->vLTLProperties_global );
        pAbc->vLTLProperties_global = NULL;
    }
    pAbc->vLTLProperties_global = Vec_PtrAlloc(Vec_PtrSize(pNtk->vLtlProperties));
    Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pLtlFormula, i )
    {
        tempFormula = (char *)malloc( sizeof(char)*(strlen(pLtlFormula)+1) );
        sprintf( tempFormula, "%s", pLtlFormula );
        Vec_PtrPush( pAbc->vLTLProperties_global, tempFormula );
    }
}